

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

bool __thiscall ON_Quaternion::GetRotation(ON_Quaternion *this,double *angle,ON_3dVector *axis)

{
  double dVar1;
  bool local_39;
  double local_38;
  double s;
  ON_3dVector *axis_local;
  double *angle_local;
  ON_Quaternion *this_local;
  
  dVar1 = Length(this);
  if (dVar1 <= 2.2250738585072014e-308) {
    local_38 = 0.0;
  }
  else {
    local_38 = acos(this->a / dVar1);
    local_38 = local_38 * 2.0;
  }
  *angle = local_38;
  axis->x = this->b;
  axis->y = this->c;
  axis->z = this->d;
  local_39 = ON_3dVector::Unitize(axis);
  local_39 = local_39 && 2.2250738585072014e-308 < dVar1;
  return local_39;
}

Assistant:

bool ON_Quaternion::GetRotation(double& angle, ON_3dVector& axis) const
{
  const double s = Length();
  angle = (s > ON_DBL_MIN) ? 2.0*acos(a/s) : 0.0;
  axis.x = b;
  axis.y = c;
  axis.z = d;
  return (axis.Unitize() && s > ON_DBL_MIN);
}